

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.cpp
# Opt level: O2

bool __thiscall tl::CStrT<char>::operator==(CStrT<char> *this,CStrT<char> o)

{
  char *pcVar1;
  char *pcVar2;
  ulong uVar3;
  bool bVar4;
  
  if (this->_size != o._size) {
    return false;
  }
  uVar3 = 0;
  do {
    bVar4 = o._size == uVar3;
    if (bVar4) {
      return bVar4;
    }
    pcVar1 = this->_str + uVar3;
    pcVar2 = o._str + uVar3;
    uVar3 = uVar3 + 1;
  } while (*pcVar1 == *pcVar2);
  return bVar4;
}

Assistant:

bool CStrT<CharT>::operator==(CStrT o)const
{
    if(_size != o._size)
        return false;
    for(u32 i=0; i<_size; i++) {
        if(_str[i] != o._str[i])
            return false;
    }
    return true;
}